

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary_t.cpp
# Opt level: O2

dictionary_t * __thiscall deci::dictionary_t::operator=(dictionary_t *this,dictionary_t *move)

{
  _Hash_node_base *p_Var1;
  __node_base *p_Var2;
  
  if (this != move) {
    p_Var2 = &(this->storage)._M_h._M_before_begin;
    while (p_Var2 = p_Var2->_M_nxt, p_Var2 != (__node_base *)0x0) {
      p_Var1 = *(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var2 + 2))->_M_max_load_factor;
      (*(code *)(p_Var2[1]._M_nxt)->_M_nxt[3]._M_nxt)();
      (*(code *)p_Var1->_M_nxt[3]._M_nxt)(p_Var1);
    }
    std::
    _Hashtable<deci::value_t_*,_std::pair<deci::value_t_*const,_deci::value_t_*>,_std::allocator<std::pair<deci::value_t_*const,_deci::value_t_*>_>,_std::__detail::_Select1st,_deci::value_equal_to_t,_deci::value_hash_t,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::clear(&(this->storage)._M_h);
    std::
    _Hashtable<deci::value_t_*,_std::pair<deci::value_t_*const,_deci::value_t_*>,_std::allocator<std::pair<deci::value_t_*const,_deci::value_t_*>_>,_std::__detail::_Select1st,_deci::value_equal_to_t,_deci::value_hash_t,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::operator=(&(this->storage)._M_h,&(move->storage)._M_h);
  }
  return this;
}

Assistant:

dictionary_t& dictionary_t::operator = (dictionary_t&& move) {
    if (this != &move) {
      for (auto el: this->storage) {
        el.first->Delete();
        el.second->Delete();
      }
      this->storage.clear();
      this->storage = std::move(move.storage);
    }
    return *this;
  }